

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

nni_msg * nni_msg_unique(nni_msg *m)

{
  int iVar1;
  nni_msg *in_RAX;
  nni_msg *local_18;
  nni_msg *m2;
  
  local_18 = in_RAX;
  iVar1 = nni_atomic_get(&m->m_refcnt);
  if (iVar1 != 1) {
    iVar1 = nni_msg_dup(&local_18,m);
    if (iVar1 != 0) {
      local_18 = (nni_msg *)0x0;
    }
    nni_msg_free(m);
    m = local_18;
  }
  return m;
}

Assistant:

nni_msg *
nni_msg_unique(nni_msg *m)
{
	nni_msg *m2;

	// If we already have an exclusive copy, just keep using it.
	if (nni_atomic_get(&m->m_refcnt) == 1) {
		return (m);
	}
	// Otherwise we need to make a copy
	if (nni_msg_dup(&m2, m) != 0) {
		m2 = NULL;
	}
	nni_msg_free(m);
	return (m2);
}